

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::request_append_entries(raft_server *this)

{
  bool bVar1;
  int32 iVar2;
  size_type sVar3;
  shared_ptr<nuraft::peer> *in_RDI;
  raft_server *in_stack_00000028;
  peer_itor it;
  uint64_t leader_index;
  ulong in_stack_000001e0;
  raft_server *in_stack_000001e8;
  ptr<peer> *in_stack_00000570;
  raft_server *in_stack_00000578;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *in_stack_ffffffffffffffa8;
  undefined1 local_38 [40];
  uint64_t local_10;
  
  sVar3 = std::
          unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
          ::size((unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
                  *)0x1770ff);
  if ((sVar3 == 0) || (iVar2 = get_quorum_for_commit(in_stack_00000028), iVar2 == 0)) {
    local_10 = get_current_leader_index(this);
    commit(in_stack_000001e8,in_stack_000001e0);
  }
  else {
    local_38._24_8_ =
         std::
         unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
         ::begin(in_stack_ffffffffffffffa8);
    std::__detail::
    _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
    _Node_const_iterator
              ((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                *)in_RDI,
               (_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *
               )in_stack_ffffffffffffffa8);
    while( true ) {
      local_38._16_8_ =
           std::
           unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
           ::end(in_stack_ffffffffffffffa8);
      bVar1 = std::__detail::operator!=
                        ((_Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                          *)(local_38 + 0x20),
                         (_Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                          *)(local_38 + 0x10));
      if (!bVar1) break;
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
      operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)0x177191);
      in_stack_ffffffffffffffa8 =
           (unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
            *)local_38;
      std::shared_ptr<nuraft::peer>::shared_ptr
                (in_RDI,(shared_ptr<nuraft::peer> *)in_stack_ffffffffffffffa8);
      request_append_entries(in_stack_00000578,in_stack_00000570);
      std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x1771c0);
      std::__detail::
      _Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
      operator++((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                  *)in_RDI);
    }
  }
  return;
}

Assistant:

void raft_server::request_append_entries() {
    // Special case:
    //   1) one-node cluster, OR
    //   2) quorum size == 1 (including leader).
    //
    // In those cases, we may not enter `handle_append_entries_resp`,
    // which calls `commit()` function.
    // We should call it here.
    if ( peers_.size() == 0 ||
         get_quorum_for_commit() == 0 ) {
        uint64_t leader_index = get_current_leader_index();
        commit(leader_index);
        return;
    }

    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        request_append_entries(it->second);
    }
}